

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

istream * operator>>(istream *strm,Employee *obj)

{
  operator>>((istream *)&std::cin,&obj->super_Person);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hourWork: ",10);
  std::istream::operator>>((istream *)strm,&obj->hourWork);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"salaryPerHour: ",0xf);
  std::istream::operator>>((istream *)strm,&obj->salaryPerHour);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"workToDo: ",10);
  std::istream::operator>>((istream *)strm,&obj->workToDo);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"workDone: ",10);
  std::istream::operator>>((istream *)strm,&obj->workDone);
  return strm;
}

Assistant:

istream &operator>>(istream &strm, Employee &obj) {
    cin >> static_cast<Person &>(obj);
    cout << "hourWork: ";
    strm >> obj.hourWork;
    cout << "salaryPerHour: ";
    strm >> obj.salaryPerHour;
    cout << "workToDo: ";
    strm >> obj.workToDo;
    cout << "workDone: ";
    strm >> obj.workDone;
    return strm;
}